

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena-test.c++
# Opt level: O0

void __thiscall kj::anon_unknown_0::TestCase247::run(TestCase247 *this)

{
  uchar *puVar1;
  uchar *puVar2;
  size_t __n;
  ArrayPtr<unsigned_char> AVar3;
  uchar *local_78;
  uchar *local_70;
  bool local_62;
  bool local_61;
  bool _kj_shouldLog_1;
  uchar *puStack_60;
  bool _kj_shouldLog;
  byte *b2;
  ArrayPtr<unsigned_char> arr;
  byte *b1;
  Arena arena;
  TestCase247 *this_local;
  
  arena.currentChunk = (ChunkHeader *)this;
  Arena::Arena((Arena *)&b1,0x400);
  puVar1 = Arena::allocate<unsigned_char>((Arena *)&b1);
  AVar3 = Arena::allocateArray<unsigned_char>((Arena *)&b1,0x400);
  arr.ptr = (uchar *)AVar3.size_;
  b2 = AVar3.ptr;
  puStack_60 = Arena::allocate<unsigned_char>((Arena *)&b1);
  puVar2 = ArrayPtr<unsigned_char>::begin((ArrayPtr<unsigned_char> *)&b2);
  if ((puVar1 <= puVar2) &&
     (puVar2 = ArrayPtr<unsigned_char>::begin((ArrayPtr<unsigned_char> *)&b2),
     puVar2 <= puVar1 + 0x200)) {
    local_61 = _::Debug::shouldLog(ERROR);
    while (local_61 != false) {
      _::Debug::log<char_const(&)[62]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/arena-test.c++"
                 ,0x101,ERROR,
                 "\"failed: expected \" \"arr.begin() < &b1 || arr.begin() > &b1 + 512\"",
                 (char (*) [62])"failed: expected arr.begin() < &b1 || arr.begin() > &b1 + 512");
      local_61 = false;
    }
  }
  puVar1 = ArrayPtr<unsigned_char>::end((ArrayPtr<unsigned_char> *)&b2);
  if (puVar1 != puStack_60) {
    local_62 = _::Debug::shouldLog(ERROR);
    while (local_62 != false) {
      local_70 = ArrayPtr<unsigned_char>::end((ArrayPtr<unsigned_char> *)&b2);
      local_78 = puStack_60;
      _::Debug::log<char_const(&)[38],unsigned_char*,unsigned_char*>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/arena-test.c++"
                 ,0x104,ERROR,"\"failed: expected \" \"(arr.end()) == (&b2)\", arr.end(), &b2",
                 (char (*) [38])"failed: expected (arr.end()) == (&b2)",&local_70,&local_78);
      local_62 = false;
    }
  }
  puVar1 = ArrayPtr<unsigned_char>::begin((ArrayPtr<unsigned_char> *)&b2);
  __n = ArrayPtr<unsigned_char>::size((ArrayPtr<unsigned_char> *)&b2);
  memset(puVar1,0xbe,__n);
  Arena::~Arena((Arena *)&b1);
  return;
}

Assistant:

TEST(Arena, TooBig) {
  Arena arena(1024);

  byte& b1 = arena.allocate<byte>();

  ArrayPtr<byte> arr = arena.allocateArray<byte>(1024);

  byte& b2 = arena.allocate<byte>();

  // The array should not have been allocated anywhere near that first byte.
  EXPECT_TRUE(arr.begin() < &b1 || arr.begin() > &b1 + 512);

  // The next byte should have been allocated after the array.
  EXPECT_EQ(arr.end(), &b2);

  // Write to the array to make sure it's valid.
  memset(arr.begin(), 0xbe, arr.size());
}